

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int re_parse_expect(REParseState *s,uint8_t **pp,int c)

{
  if ((uint)**pp == c) {
    *pp = *pp + 1;
    return 0;
  }
  re_parse_error(s,"expecting \'%c\'");
  return -1;
}

Assistant:

static int re_parse_expect(REParseState *s, const uint8_t **pp, int c)
{
    const uint8_t *p;
    p = *pp;
    if (*p != c)
        return re_parse_error(s, "expecting '%c'", c);
    p++;
    *pp = p;
    return 0;
}